

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest9::initTest(FunctionalTest9 *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_00;
  allocator<char> local_f1;
  uint xfb_bo_size;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  string local_48;
  uint local_24;
  char *pcStack_20;
  uint n_xfb_varyings;
  char *xfb_varyings [1];
  Functions *gl;
  FunctionalTest9 *this_local;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  pcStack_20 = "result";
  local_24 = 1;
  xfb_varyings[0] = (char *)CONCAT44(extraout_var,iVar3);
  getVertexShaderBody_abi_cxx11_(&local_48,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&xfb_bo_size,"",&local_f1);
  bVar2 = Utils::buildProgram((Functions *)CONCAT44(extraout_var,iVar3),&local_48,&local_68,
                              &local_a0,&local_c8,(string *)&xfb_bo_size,&stack0xffffffffffffffe0,
                              &local_24,&this->m_vs_id,(GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,
                              (GLuint *)0x0,&this->m_po_id);
  std::__cxx11::string::~string((string *)&xfb_bo_size);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_48);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    uVar1 = this->m_n_points_to_draw;
    (**(code **)(xfb_varyings[0] + 0x6c8))(1,&this->m_xfb_bo_id);
    dVar4 = (**(code **)(xfb_varyings[0] + 0x800))();
    glu::checkError(dVar4,"glGenBuffers() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13ae);
    (**(code **)(xfb_varyings[0] + 0x40))(0x8c8e,this->m_xfb_bo_id);
    dVar4 = (**(code **)(xfb_varyings[0] + 0x800))();
    glu::checkError(dVar4,"glBindBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13b1);
    (**(code **)(xfb_varyings[0] + 0x48))(0x8c8e,0,this->m_xfb_bo_id);
    dVar4 = (**(code **)(xfb_varyings[0] + 0x800))();
    glu::checkError(dVar4,"glBindBufferBase() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13b4);
    (**(code **)(xfb_varyings[0] + 0x150))(0x8c8e,uVar1 << 4,0,0x88e6);
    dVar4 = (**(code **)(xfb_varyings[0] + 0x800))();
    glu::checkError(dVar4,"glBufferData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13b8);
    (**(code **)(xfb_varyings[0] + 0x708))(1,&this->m_vao_id);
    dVar4 = (**(code **)(xfb_varyings[0] + 0x800))();
    glu::checkError(dVar4,"glGenVertexArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13bc);
    (**(code **)(xfb_varyings[0] + 0xd8))(this->m_vao_id);
    dVar4 = (**(code **)(xfb_varyings[0] + 0x800))();
    glu::checkError(dVar4,"glBindVertexArray() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13bf);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program failed to link successfully",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x13a7);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void FunctionalTest9::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up program object */
	const char* xfb_varyings[] = { "result" };

	const unsigned int n_xfb_varyings = sizeof(xfb_varyings) / sizeof(xfb_varyings[0]);
	if (!Utils::buildProgram(gl, getVertexShaderBody(), "",					  /* tc_body */
							 "",											  /* te_body */
							 "",											  /* gs_body */
							 "",											  /* fs_body */
							 xfb_varyings, n_xfb_varyings, &m_vs_id, DE_NULL, /* out_tc_id */
							 DE_NULL,										  /* out_te_id */
							 DE_NULL,										  /* out_gs_id */
							 DE_NULL,										  /* out_fs_id */
							 &m_po_id))
	{
		TCU_FAIL("Program failed to link successfully");
	}

	/* Set up a buffer object we will use to hold XFB data */
	const unsigned int xfb_bo_size = static_cast<unsigned int>(sizeof(float) * 4 /* components */ * m_n_points_to_draw);

	gl.genBuffers(1, &m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_bo_size, DE_NULL, /* data */
				  GL_STATIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Generate & bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");
}